

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

void __thiscall Assimp::IFC::anon_unknown_9::Conic::~Conic(Conic *this)

{
  code *pcVar1;
  Conic *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Conic(const Schema_2x3::IfcConic& entity, ConversionData& conv)
    : Curve(entity,conv) {
        IfcMatrix4 trafo;
        ConvertAxisPlacement(trafo,*entity.Position,conv);

        // for convenience, extract the matrix rows
        location = IfcVector3(trafo.a4,trafo.b4,trafo.c4);
        p[0] = IfcVector3(trafo.a1,trafo.b1,trafo.c1);
        p[1] = IfcVector3(trafo.a2,trafo.b2,trafo.c2);
        p[2] = IfcVector3(trafo.a3,trafo.b3,trafo.c3);
    }